

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O3

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundCaseExpression *expr,ExpressionExecutorState *root)

{
  pointer pBVar1;
  CaseExpressionState *this_00;
  pointer pCVar2;
  type pEVar3;
  pointer *__ptr;
  pointer this_01;
  _Head_base<0UL,_duckdb::CaseExpressionState_*,_false> local_38;
  
  this_00 = (CaseExpressionState *)operator_new(0xe0);
  CaseExpressionState::CaseExpressionState(this_00,&expr->super_Expression,root);
  pBVar1 = (expr->case_checks).
           super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38._M_head_impl = this_00;
  for (this_01 = (expr->case_checks).
                 super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
                 super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pBVar1; this_01 = this_01 + 1
      ) {
    pCVar2 = unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
             ::operator->((unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
                           *)&local_38);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this_01->when_expr);
    ExpressionState::AddChild(&pCVar2->super_ExpressionState,pEVar3);
    pCVar2 = unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
             ::operator->((unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
                           *)&local_38);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&this_01->then_expr);
    ExpressionState::AddChild(&pCVar2->super_ExpressionState,pEVar3);
  }
  pCVar2 = unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
           ::operator->((unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
                         *)&local_38);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->else_expr);
  ExpressionState::AddChild(&pCVar2->super_ExpressionState,pEVar3);
  pCVar2 = unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
           ::operator->((unique_ptr<duckdb::CaseExpressionState,_std::default_delete<duckdb::CaseExpressionState>,_true>
                         *)&local_38);
  ExpressionState::Finalize(&pCVar2->super_ExpressionState);
  (this->expressions).
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_38._M_head_impl;
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundCaseExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<CaseExpressionState>(expr, root);
	for (auto &case_check : expr.case_checks) {
		result->AddChild(*case_check.when_expr);
		result->AddChild(*case_check.then_expr);
	}
	result->AddChild(*expr.else_expr);

	result->Finalize();
	return std::move(result);
}